

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O3

Vec_Str_t * Abc_ManReadFile(char *pFileName)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  uint uVar6;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (Vec_Str_t *)0x0;
  }
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  pcVar5 = (char *)malloc(100);
  pVVar4->pArray = pcVar5;
  iVar3 = fgetc(__stream);
  if (iVar3 == -1) {
    uVar6 = 0;
  }
  else {
    do {
      uVar6 = pVVar4->nSize;
      if (uVar6 == pVVar4->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          sVar1 = (ulong)uVar6 * 2;
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar1);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,sVar1);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = (int)sVar1;
        }
      }
      else {
        pcVar5 = pVVar4->pArray;
      }
      pVVar4->nSize = uVar6 + 1;
      pcVar5[(int)uVar6] = (char)iVar3;
      iVar3 = fgetc(__stream);
    } while (iVar3 != -1);
    uVar2 = pVVar4->nCap;
    uVar6 = pVVar4->nSize;
    if (uVar6 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
        }
        pVVar4->pArray = pcVar5;
        pVVar4->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)uVar2 * 2;
        if (pVVar4->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar1);
        }
        else {
          pcVar5 = (char *)realloc(pVVar4->pArray,sVar1);
        }
        pVVar4->pArray = pcVar5;
        pVVar4->nCap = (int)sVar1;
      }
      goto LAB_002bdcbd;
    }
  }
  pcVar5 = pVVar4->pArray;
LAB_002bdcbd:
  pVVar4->nSize = uVar6 + 1;
  pcVar5[(int)uVar6] = '\0';
  fclose(__stream);
  return pVVar4;
}

Assistant:

Vec_Str_t * Abc_ManReadFile( char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    int c;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vStr = Vec_StrAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
        Vec_StrPush( vStr, (char)c );
    Vec_StrPush( vStr, '\0' );
    fclose( pFile );
    return vStr;
}